

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdTruthCompose_rec(word *pFunc,word (*pFanins) [64],word *pRes,int nVars,int nWordsR)

{
  int nWords;
  int iVar1;
  word local_438;
  word pTtTemp [2] [64];
  int nWordsF;
  int nWordsR_local;
  int nVars_local;
  word *pRes_local;
  word (*pFanins_local) [64];
  word *pFunc_local;
  
  if (nVars < 7) {
    Dau_DsdTruth6Compose_rec(*pFunc,pFanins,pRes,nVars,nWordsR);
  }
  else {
    nWords = Abc_TtWordNum(nVars);
    if (nWords < 2) {
      __assert_fail("nWordsF > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                    ,0x1fe,"void Dau_DsdTruthCompose_rec(word *, word (*)[64], word *, int, int)");
    }
    iVar1 = Abc_TtIsConst0(pFunc,nWords);
    if (iVar1 == 0) {
      iVar1 = Abc_TtIsConst1(pFunc,nWords);
      if (iVar1 == 0) {
        iVar1 = Abc_TtHasVar(pFunc,nVars,nVars + -1);
        if (iVar1 == 0) {
          Dau_DsdTruthCompose_rec(pFunc,pFanins,pRes,nVars + -1,nWordsR);
        }
        else {
          iVar1 = nVars + -1;
          Dau_DsdTruthCompose_rec(pFunc,pFanins,&local_438,iVar1,nWordsR);
          Dau_DsdTruthCompose_rec(pFunc + nWords / 2,pFanins,pTtTemp[0] + 0x3f,iVar1,nWordsR);
          Abc_TtMux(pRes,pFanins[iVar1],pTtTemp[0] + 0x3f,&local_438,nWordsR);
        }
      }
      else {
        Abc_TtConst1(pRes,nWordsR);
      }
    }
    else {
      Abc_TtConst0(pRes,nWordsR);
    }
  }
  return;
}

Assistant:

void Dau_DsdTruthCompose_rec( word * pFunc, word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], word * pRes, int nVars, int nWordsR )
{
    int nWordsF;
    if ( nVars <= 6 )
    {
        Dau_DsdTruth6Compose_rec( pFunc[0], pFanins, pRes, nVars, nWordsR );
        return;
    }
    nWordsF = Abc_TtWordNum( nVars );
    assert( nWordsF > 1 );
    if ( Abc_TtIsConst0(pFunc, nWordsF) )
    {
        Abc_TtConst0( pRes, nWordsR );
        return;
    }
    if ( Abc_TtIsConst1(pFunc, nWordsF) )
    {
        Abc_TtConst1( pRes, nWordsR );
        return;
    }
    if ( !Abc_TtHasVar( pFunc, nVars, nVars-1 ) )
    {
        Dau_DsdTruthCompose_rec( pFunc, pFanins, pRes, nVars-1, nWordsR );
        return;
    }
    {
        word pTtTemp[2][DAU_MAX_WORD];
        nVars--;
        Dau_DsdTruthCompose_rec( pFunc,             pFanins, pTtTemp[0], nVars, nWordsR );
        Dau_DsdTruthCompose_rec( pFunc + nWordsF/2, pFanins, pTtTemp[1], nVars, nWordsR );
        Abc_TtMux( pRes, pFanins[nVars], pTtTemp[1], pTtTemp[0], nWordsR );
        return;
    }
}